

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  uint *puVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  
  do {
    uVar2 = *(uchar *)((long)&this->m_arith_base + 3);
    uVar4 = (this->m_arith_output_buf).m_size;
    if (uVar4 < (this->m_arith_output_buf).m_capacity) {
LAB_0011f062:
      (this->m_arith_output_buf).m_p[(this->m_arith_output_buf).m_size] = uVar2;
      puVar1 = &(this->m_arith_output_buf).m_size;
      *puVar1 = *puVar1 + 1;
      bVar5 = true;
    }
    else {
      bVar5 = false;
      bVar3 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_arith_output_buf,uVar4 + 1,true,1,
                         (object_mover)0x0,true);
      if (bVar3) goto LAB_0011f062;
    }
    if (bVar5 == false) {
      return false;
    }
    this->m_total_bits_written = this->m_total_bits_written + 8;
    this->m_arith_base = this->m_arith_base << 8;
    uVar4 = this->m_arith_length << 8;
    this->m_arith_length = uVar4;
    if (0xffffff < uVar4) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool symbol_codec::arith_renorm_enc_interval()
   {
      do
      {
         if (!m_arith_output_buf.try_push_back( (m_arith_base >> 24) & 0xFF ))
            return false;
         m_total_bits_written += 8;

         m_arith_base <<= 8;
      } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
      return true;
   }